

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O3

stmm_generator * stmm_init_gen(stmm_table *table)

{
  stmm_generator *psVar1;
  
  psVar1 = (stmm_generator *)malloc(0x18);
  if (psVar1 != (stmm_generator *)0x0) {
    psVar1->table = table;
    psVar1->entry = (stmm_table_entry *)0x0;
    psVar1->index = 0;
  }
  return psVar1;
}

Assistant:

stmm_generator *
stmm_init_gen (stmm_table *table)
{
    stmm_generator *gen;

    gen = ABC_ALLOC(stmm_generator, 1);
    if (gen == NULL) {
    return NULL;
    }
    gen->table = table;
    gen->entry = NULL;
    gen->index = 0;
    return gen;
}